

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Char * poolAppend(STRING_POOL *pool,ENCODING *enc,char *ptr,char *end)

{
  int iVar1;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  STRING_POOL *pool_local;
  
  end_local = ptr;
  ptr_local = (char *)enc;
  enc_local = (ENCODING *)pool;
  if (pool->ptr != (XML_Char *)0x0) goto LAB_0019334d;
  iVar1 = poolGrow(pool);
  while( true ) {
    if (iVar1 == 0) {
      return (XML_Char *)0x0;
    }
LAB_0019334d:
    (**(code **)(ptr_local + 0x78))
              (ptr_local,&end_local,end,enc_local->scanners + 3,enc_local->scanners[2]);
    if (end_local == end) break;
    iVar1 = poolGrow((STRING_POOL *)enc_local);
  }
  return (XML_Char *)enc_local->literalScanners[0];
}

Assistant:

static
XML_Char *poolAppend(STRING_POOL *pool, const ENCODING *enc,
                     const char *ptr, const char *end)
{
  if (!pool->ptr && !poolGrow(pool))
    return 0;
  for (;;) {
    XmlConvert(enc, &ptr, end, (ICHAR **)&(pool->ptr), (ICHAR *)pool->end);
    if (ptr == end)
      break;
    if (!poolGrow(pool))
      return 0;
  }
  return pool->start;
}